

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  sqlite3_index_constraint *psVar1;
  byte bVar2;
  sqlite3_index_constraint *psVar3;
  sqlite3_index_constraint_usage *psVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 uVar14;
  char zIdxStr [41];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined1 uStack_40;
  undefined7 local_3f;
  undefined1 uStack_38;
  undefined8 uStack_37;
  
  uStack_38 = 0;
  uStack_37 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  local_3f = 0;
  local_58 = 0;
  uStack_50 = 0;
  uVar7 = (ulong)pIdxInfo->nConstraint;
  if ((long)uVar7 < 1) {
    bVar9 = true;
  }
  else {
    lVar11 = 0;
    bVar9 = false;
    do {
      if ((&pIdxInfo->aConstraint->op)[lVar11] == '@') {
        bVar9 = true;
      }
      lVar11 = lVar11 + 0xc;
    } while (uVar7 * 0xc != lVar11);
    bVar9 = !bVar9;
  }
  if (pIdxInfo->nConstraint < 1) {
    iVar10 = 0;
  }
  else {
    psVar3 = pIdxInfo->aConstraint;
    uVar12 = 0;
    iVar10 = 0;
    do {
      psVar1 = psVar3 + uVar12;
      if ((((bVar9) && (psVar1->usable != '\0')) && (psVar1->iColumn == 0)) &&
         (psVar1->op == '\x02')) {
        if (uVar12 == 0) {
          uVar13 = 0;
        }
        else {
          psVar4 = pIdxInfo->aConstraintUsage;
          uVar13 = 0;
          do {
            psVar4[uVar13].argvIndex = 0;
            psVar4[uVar13].omit = '\0';
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        pIdxInfo->idxNum = 1;
        psVar4 = pIdxInfo->aConstraintUsage;
        psVar4[uVar12].argvIndex = 1;
        psVar4[uVar13].omit = '\x01';
        pIdxInfo->estimatedCost = 30.0;
        pIdxInfo->estimatedRows = 1;
        pIdxInfo->idxFlags = 1;
        bVar6 = false;
      }
      else {
        bVar6 = true;
        if ((psVar1->usable != '\0') &&
           (((0 < psVar1->iColumn && (psVar1->iColumn <= (int)(uint)(byte)tab[1].field_0xd)) ||
            (psVar1->op == '@')))) {
          bVar2 = psVar1->op;
          if (bVar2 < 0x10) {
            if (bVar2 == 2) {
              uVar14 = 0x41;
              goto LAB_001c9318;
            }
            if (bVar2 == 4) {
              uVar14 = 0x45;
              goto LAB_001c9318;
            }
            if (bVar2 == 8) {
              uVar14 = 0x42;
              goto LAB_001c9318;
            }
LAB_001c9308:
            bVar5 = true;
            uVar14 = 0;
          }
          else {
            if (bVar2 == 0x10) {
              uVar14 = 0x43;
            }
            else if (bVar2 == 0x20) {
              uVar14 = 0x44;
            }
            else {
              if (bVar2 != 0x40) goto LAB_001c9308;
              uVar14 = 0x46;
            }
LAB_001c9318:
            bVar5 = false;
          }
          if (!bVar5) {
            *(undefined1 *)((long)&local_58 + (long)iVar10) = uVar14;
            *(char *)((long)&local_58 + (long)iVar10 + 1) = (char)psVar1->iColumn + '/';
            psVar4 = pIdxInfo->aConstraintUsage;
            psVar4[uVar12].argvIndex = (iVar10 - (iVar10 + 2 >> 0x1f)) + 2 >> 1;
            psVar4[uVar12].omit = '\x01';
            iVar10 = iVar10 + 2;
          }
        }
      }
      if (!bVar6) {
        return 0;
      }
      uVar12 = uVar12 + 1;
    } while ((uVar12 < uVar7) && (iVar10 < 0x28));
  }
  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if (0 < iVar10) {
    pcVar8 = sqlite3_mprintf("%s",&local_58);
    pIdxInfo->idxStr = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return 7;
    }
  }
  lVar11 = (long)tab[3].pModule >> ((byte)((uint)(iVar10 - (iVar10 >> 0x1f)) >> 1) & 0x3f);
  pIdxInfo->estimatedCost = (double)lVar11 * 6.0;
  pIdxInfo->estimatedRows = lVar11;
  return 0;
}

Assistant:

static int rtreeBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  Rtree *pRtree = (Rtree*)tab;
  int rc = SQLITE_OK;
  int ii;
  int bMatch = 0;                 /* True if there exists a MATCH constraint */
  i64 nRow;                       /* Estimated rows returned by this scan */

  int iIdx = 0;
  char zIdxStr[RTREE_MAX_DIMENSIONS*8+1];
  memset(zIdxStr, 0, sizeof(zIdxStr));

  /* Check if there exists a MATCH constraint - even an unusable one. If there
  ** is, do not consider the lookup-by-rowid plan as using such a plan would
  ** require the VDBE to evaluate the MATCH constraint, which is not currently
  ** possible. */
  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    if( pIdxInfo->aConstraint[ii].op==SQLITE_INDEX_CONSTRAINT_MATCH ){
      bMatch = 1;
    }
  }

  assert( pIdxInfo->idxStr==0 );
  for(ii=0; ii<pIdxInfo->nConstraint && iIdx<(int)(sizeof(zIdxStr)-1); ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];

    if( bMatch==0 && p->usable 
     && p->iColumn==0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ 
    ){
      /* We have an equality constraint on the rowid. Use strategy 1. */
      int jj;
      for(jj=0; jj<ii; jj++){
        pIdxInfo->aConstraintUsage[jj].argvIndex = 0;
        pIdxInfo->aConstraintUsage[jj].omit = 0;
      }
      pIdxInfo->idxNum = 1;
      pIdxInfo->aConstraintUsage[ii].argvIndex = 1;
      pIdxInfo->aConstraintUsage[jj].omit = 1;

      /* This strategy involves a two rowid lookups on an B-Tree structures
      ** and then a linear search of an R-Tree node. This should be 
      ** considered almost as quick as a direct rowid lookup (for which 
      ** sqlite uses an internal cost of 0.0). It is expected to return
      ** a single row.
      */ 
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
      return SQLITE_OK;
    }

    if( p->usable
    && ((p->iColumn>0 && p->iColumn<=pRtree->nDim2)
        || p->op==SQLITE_INDEX_CONSTRAINT_MATCH)
    ){
      u8 op;
      switch( p->op ){
        case SQLITE_INDEX_CONSTRAINT_EQ:    op = RTREE_EQ;    break;
        case SQLITE_INDEX_CONSTRAINT_GT:    op = RTREE_GT;    break;
        case SQLITE_INDEX_CONSTRAINT_LE:    op = RTREE_LE;    break;
        case SQLITE_INDEX_CONSTRAINT_LT:    op = RTREE_LT;    break;
        case SQLITE_INDEX_CONSTRAINT_GE:    op = RTREE_GE;    break;
        case SQLITE_INDEX_CONSTRAINT_MATCH: op = RTREE_MATCH; break;
        default:                            op = 0;           break;
      }
      if( op ){
        zIdxStr[iIdx++] = op;
        zIdxStr[iIdx++] = (char)(p->iColumn - 1 + '0');
        pIdxInfo->aConstraintUsage[ii].argvIndex = (iIdx/2);
        pIdxInfo->aConstraintUsage[ii].omit = 1;
      }
    }
  }

  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if( iIdx>0 && 0==(pIdxInfo->idxStr = sqlite3_mprintf("%s", zIdxStr)) ){
    return SQLITE_NOMEM;
  }

  nRow = pRtree->nRowEst >> (iIdx/2);
  pIdxInfo->estimatedCost = (double)6.0 * (double)nRow;
  pIdxInfo->estimatedRows = nRow;

  return rc;
}